

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

sexp_conflict
sexp_25_send_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg2,
                 sexp_conflict arg3,sexp_conflict arg5,sexp_conflict arg6,sexp_conflict arg7,
                 sexp_conflict arg8)

{
  sexp_conflict psVar1;
  int sock;
  int flags;
  socklen_t addr_len;
  long lVar2;
  sexp addr;
  
  if (((ulong)arg2 & 3) == 0) {
    if (arg2->tag == 0x12) goto LAB_00102e68;
  }
  else if (((ulong)arg2 & 1) != 0) {
LAB_00102e68:
    if ((((ulong)arg3 & 3) != 0) || (arg3->tag != 8)) {
      lVar2 = 8;
      arg2 = arg3;
      goto LAB_00102e9c;
    }
    if ((((ulong)arg5 & 1) == 0) && ((((ulong)arg5 & 2) != 0 || (arg5->tag != 0xc)))) {
      lVar2 = 2;
      arg2 = arg5;
      goto LAB_00102e9c;
    }
    if (((ulong)arg6 & 3) == 0) {
      if ((arg6 != (sexp_conflict)0x3e) &&
         ((long)(((self->value).type.finalize_name)->value).type.setters >> 1 != (ulong)arg6->tag))
      goto LAB_00102ec5;
    }
    else if (arg6 != (sexp_conflict)0x3e) {
LAB_00102ec5:
      lVar2 = (long)(((self->value).type.finalize_name)->value).type.setters >> 1;
      arg2 = arg6;
      goto LAB_00102e9c;
    }
    if ((((ulong)arg7 & 1) != 0) || ((((ulong)arg7 & 2) == 0 && (arg7->tag == 0xc)))) {
      if ((((ulong)arg2 & 3) == 0) && (arg2->tag == 0x12)) {
        sock = (int)(arg2->value).fileno.fd;
      }
      else {
        sock = (int)((long)arg2 >> 1);
      }
      if (((ulong)arg5 & 1) == 0) {
        if ((((ulong)arg5 & 2) == 0) && (arg5->tag == 0xc)) {
          flags = (int)(arg5->value).flonum_bits[0] * (int)(arg5->value).uvector.length;
        }
        else {
          flags = 0;
        }
      }
      else {
        flags = (int)((long)arg5 >> 1);
      }
      if (arg6 == (sexp_conflict)0x3e) {
        addr = (sexp)0x0;
      }
      else {
        addr = (arg6->value).type.slots;
      }
      psVar1 = (arg3->value).type.name;
      if (((ulong)arg7 & 1) == 0) {
        if ((((ulong)arg7 & 2) == 0) && (arg7->tag == 0xc)) {
          addr_len = (int)(arg7->value).flonum_bits[0] * (int)(arg7->value).uvector.length;
        }
        else {
          addr_len = 0;
        }
      }
      else {
        addr_len = (socklen_t)((long)arg7 >> 1);
      }
      psVar1 = sexp_sendto(ctx,psVar1,sock,(void *)((long)&arg3->value + 8),(size_t)psVar1,flags,
                           (sockaddr *)addr,addr_len,arg8);
      return psVar1;
    }
    lVar2 = 2;
    arg2 = arg7;
    goto LAB_00102e9c;
  }
  lVar2 = 0x12;
LAB_00102e9c:
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,lVar2,arg2);
  return psVar1;
}

Assistant:

sexp sexp_25_send_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg2, sexp arg3, sexp arg5, sexp arg6, sexp arg7, sexp arg8) {
  sexp res;
  if (! (sexp_filenop(arg2) || sexp_fixnump(arg2)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg2);
  if (! sexp_bytesp(arg3))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg3);
  if (! sexp_exact_integerp(arg5))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg5);
  if (! ((sexp_pointerp(arg6) && (sexp_pointer_tag(arg6) == sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_THREE)))) || sexp_not(arg6)))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_THREE)), arg6);
  if (! sexp_exact_integerp(arg7))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg7);
  res = sexp_sendto(ctx, self, (sexp_filenop(arg2) ? sexp_fileno_fd(arg2) : sexp_unbox_fixnum(arg2)), sexp_bytes_data(arg3), sexp_bytes_length(arg3), sexp_sint_value(arg5), (struct sockaddr*)sexp_cpointer_maybe_null_value(arg6), sexp_sint_value(arg7), arg8);
  return res;
}